

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleTextureNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  uint type;
  bool bVar1;
  Property *pPVar2;
  Value *this_00;
  char *pcVar3;
  allocator<char> local_421;
  aiString tex;
  
  if (node != (DDLNode *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&tex,"attrib",&local_421);
    pPVar2 = ODDLParser::DDLNode::findPropertyByName(node,(string *)&tex);
    std::__cxx11::string::~string((string *)&tex);
    if (((pPVar2 != (Property *)0x0) && (pPVar2->m_value != (Value *)0x0)) &&
       (this_00 = ODDLParser::DDLNode::getValue(node), this_00 != (Value *)0x0)) {
      tex.length = 0;
      tex.data[0] = '\0';
      memset(tex.data + 1,0x1b,0x3ff);
      pcVar3 = ODDLParser::Value::getString(this_00);
      aiString::Set(&tex,pcVar3);
      pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
      bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)Grammar::DiffuseTextureToken_abi_cxx11_);
      if (bVar1) {
        type = 1;
      }
      else {
        pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
        bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)Grammar::SpecularPowerTextureToken_abi_cxx11_);
        if (bVar1) {
          type = 2;
        }
        else {
          pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
          bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)Grammar::EmissionTextureToken_abi_cxx11_);
          if (bVar1) {
            type = 4;
          }
          else {
            pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
            bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)Grammar::OpacyTextureToken_abi_cxx11_);
            if (bVar1) {
              type = 8;
            }
            else {
              pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
              bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)Grammar::TransparencyTextureToken_abi_cxx11_);
              if (bVar1) {
                return;
              }
              pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
              bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)Grammar::NormalTextureToken_abi_cxx11_);
              if (!bVar1) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                              ,0x447,
                              "void Assimp::OpenGEX::OpenGEXImporter::handleTextureNode(ODDLParser::DDLNode *, aiScene *)"
                             );
              }
              type = 6;
            }
          }
        }
      }
      aiMaterial::AddProperty(this->m_currentMaterial,&tex,"$tex.file",type,0);
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleTextureNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "attrib" );
    if( nullptr != prop ) {
        if( nullptr != prop->m_value ) {
            Value *val( node->getValue() );
            if( nullptr != val ) {
                aiString tex;
                tex.Set( val->getString() );
                if( prop->m_value->getString() == Grammar::DiffuseTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
                } else if( prop->m_value->getString() == Grammar::SpecularPowerTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_SPECULAR( 0 ) );
                } else if( prop->m_value->getString() == Grammar::EmissionTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_EMISSIVE( 0 ) );
                } else if( prop->m_value->getString() == Grammar::OpacyTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_OPACITY( 0 ) );
                } else if( prop->m_value->getString() == Grammar::TransparencyTextureToken ) {
                    // ToDo!
                    // m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
                } else if( prop->m_value->getString() == Grammar::NormalTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_NORMALS( 0 ) );
                } else {
                    ai_assert( false );
                }
            }
        }
    }
}